

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  PositionType *this_00;
  Snapshot snapshot;
  bool bVar1;
  string *target;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmMakefile *mf;
  cmLocalGenerator *pcVar2;
  cmCompiledGeneratorExpression *pcVar3;
  char *pcVar4;
  reference ppcVar5;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar6;
  _Self local_9d0;
  _Self local_9c8;
  const_iterator li;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *allTargets;
  string local_9b0;
  undefined1 local_989;
  undefined1 local_988 [8];
  cmGeneratorTarget gDummyHead;
  string local_480;
  undefined1 local_460 [8];
  cmTarget dummyHead;
  auto_ptr<cmCompiledGeneratorExpression> local_1d8;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmCommandContext local_f8;
  Snapshot local_d0;
  cmListFileBacktrace local_b8;
  undefined1 local_78 [8];
  cmGeneratorExpression ge;
  char *prop;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *emitted_local;
  cmGeneratorTarget *tgt_local;
  string *propName_local;
  cmExportTryCompileFileGenerator *this_local;
  string *result;
  
  ge.Backtrace.Snapshot.Position.Position =
       (PositionType)cmGeneratorTarget::GetProperty(tgt,propName);
  if ((char *)ge.Backtrace.Snapshot.Position.Position == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    cmState::Snapshot::Snapshot(&local_d0,(cmState *)0x0);
    cmCommandContext::cmCommandContext(&local_f8);
    snapshot.Position.Tree = local_d0.Position.Tree;
    snapshot.State = local_d0.State;
    snapshot.Position.Position = local_d0.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace(&local_b8,snapshot,&local_f8);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_78,&local_b8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_b8);
    cmCommandContext::~cmCommandContext(&local_f8);
    target = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)&cge,target,propName,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    cmGeneratorExpression::Parse
              ((cmGeneratorExpression *)&dummyHead.Backtrace.Snapshot.Position.Position,local_78);
    this_00 = &dummyHead.Backtrace.Snapshot.Position.Position;
    r = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)this_00);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_1d8,r);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)this_00);
    cmTarget::cmTarget((cmTarget *)local_460);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_480,"try_compile_dummy_exe",
               (allocator *)
               ((long)&gDummyHead.MaxLanguageStandards._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    cmTarget::SetType((cmTarget *)local_460,EXECUTABLE,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gDummyHead.MaxLanguageStandards._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    mf = cmTarget::GetMakefile(tgt->Target);
    cmTarget::SetMakefile((cmTarget *)local_460,mf);
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(tgt);
    cmGeneratorTarget::cmGeneratorTarget
              ((cmGeneratorTarget *)local_988,(cmTarget *)local_460,pcVar2);
    local_989 = 0;
    pcVar3 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_1d8);
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(tgt);
    std::__cxx11::string::string((string *)&local_9b0);
    pcVar4 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar3,pcVar2,&this->Config,false,(cmGeneratorTarget *)local_988,tgt,
                        (cmGeneratorExpressionDAGChecker *)&cge,&local_9b0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar4,(allocator *)((long)&allTargets + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&allTargets + 7));
    std::__cxx11::string::~string((string *)&local_9b0);
    pcVar3 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_1d8);
    li._M_node = (_Base_ptr)cmCompiledGeneratorExpression::GetAllTargetsSeen(pcVar3);
    local_9c8._M_node =
         (_Base_ptr)
         std::
         set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         ::begin((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)li._M_node);
    while( true ) {
      local_9d0._M_node =
           (_Base_ptr)
           std::
           set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
           ::end(li._M_node);
      bVar1 = std::operator!=(&local_9c8,&local_9d0);
      if (!bVar1) break;
      ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&local_9c8);
      pVar6 = std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::insert(emitted,ppcVar5);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&local_9c8);
        std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
        push_back(&this->Exports,ppcVar5);
      }
      std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&local_9c8);
    }
    local_989 = 1;
    cmGeneratorTarget::~cmGeneratorTarget((cmGeneratorTarget *)local_988);
    cmTarget::~cmTarget((cmTarget *)local_460);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_1d8);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)&cge);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
                                  const std::string& propName,
                                  cmGeneratorTarget const* tgt,
                                  std::set<cmGeneratorTarget const*> &emitted)
{
  const char *prop = tgt->GetProperty(propName);
  if(!prop)
    {
    return std::string();
    }

  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
                                      tgt->GetName(),
                                      propName, 0, 0);

  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(prop);

  cmTarget dummyHead;
  dummyHead.SetType(cmState::EXECUTABLE, "try_compile_dummy_exe");
  dummyHead.SetMakefile(tgt->Target->GetMakefile());

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     false, &gDummyHead,
                                     tgt, &dagChecker);

  const std::set<cmGeneratorTarget const*> &allTargets =
      cge->GetAllTargetsSeen();
  for(std::set<cmGeneratorTarget const*>::const_iterator li =
      allTargets.begin(); li != allTargets.end(); ++li)
    {
    if(emitted.insert(*li).second)
      {
      this->Exports.push_back(*li);
      }
    }
  return result;
}